

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjToBool(jx9_value *pObj)

{
  sxi32 sVar1;
  jx9_value *pObj_local;
  
  if ((pObj->iFlags & 8U) == 0) {
    sVar1 = MemObjBooleanValue(pObj);
    pObj->x = (anon_union_8_3_18420de5_for_x)(long)sVar1;
    SyBlobRelease(&pObj->sBlob);
    pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjToBool(jx9_value *pObj)
{
	if( (pObj->iFlags & MEMOBJ_BOOL) == 0 ){
		/* Preform the conversion */
		pObj->x.iVal = MemObjBooleanValue(&(*pObj));
		/* Invalidate any prior representations */
		SyBlobRelease(&pObj->sBlob);
		MemObjSetType(pObj, MEMOBJ_BOOL);
	}
	return SXRET_OK;
}